

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O2

int s2pred::TriageCompareSin2Distance<double>(Vector3<double> *x,Vector3<double> *y,double r2)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double sin2_xy_error;
  ostream *local_10;
  
  if (r2 < 2.0) {
    dVar2 = GetSin2Distance(x,y,&sin2_xy_error);
    dVar3 = (r2 * -0.25 + 1.0) * r2;
    dVar2 = dVar2 - dVar3;
    dVar3 = dVar3 * 3.3306690738754696e-16 + sin2_xy_error;
    iVar1 = 1;
    if (dVar2 <= dVar3) {
      iVar1 = -(uint)(dVar2 < -dVar3);
    }
    return iVar1;
  }
  S2LogMessage::S2LogMessage
            ((S2LogMessage *)&sin2_xy_error,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
             ,0x1e8,kFatal,(ostream *)&std::cerr);
  std::operator<<(local_10,"Check failed: (r2) < (2.0) ");
  abort();
}

Assistant:

int TriageCompareSin2Distance(const Vector3<T>& x, const Vector3<T>& y, T r2) {
  S2_DCHECK_LT(r2, 2.0);  // Only valid for distance limits < 90 degrees.

  constexpr T T_ERR = rounding_epsilon<T>();
  T sin2_xy_error;
  T sin2_xy = GetSin2Distance(x, y, &sin2_xy_error);
  T sin2_r = r2 * (1 - 0.25 * r2);
  T sin2_r_error = 3 * T_ERR * sin2_r;
  T diff = sin2_xy - sin2_r;
  T error = sin2_xy_error + sin2_r_error;
  return (diff > error) ? 1 : (diff < -error) ? -1 : 0;
}